

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printU6ImmOperand(MCInst *MI,int OpNum,SStream *O)

{
  cs_detail *pcVar1;
  uint uVar2;
  MCOperand *op;
  int64_t iVar3;
  uint8_t *puVar4;
  uint in_ESI;
  MCInst *in_RDI;
  uint32_t Value;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar3 = MCOperand_getImm(op);
  uVar2 = (uint)iVar3;
  printUInt32((SStream *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar4 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x15;
    puVar4[0] = '\x02';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    *(ulong *)(in_RDI->flat_insn->detail->groups +
              (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1d) =
         (ulong)uVar2;
    pcVar1 = in_RDI->flat_insn->detail;
    (pcVar1->field_6).x86.opcode[0] = (pcVar1->field_6).x86.opcode[0] + '\x01';
  }
  return;
}

Assistant:

static void printU6ImmOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	unsigned int Value = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNo));
	//assert(Value <= 63 && "Invalid u6imm argument!");
	printUInt32(O, Value);

	if (MI->csh->detail) {
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = Value;
		MI->flat_insn->detail->ppc.op_count++;
	}
}